

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescue.c
# Opt level: O3

int source_callback(void *data,int len,void *user)

{
  char cVar1;
  char cVar2;
  int iVar3;
  source_data *env;
  char *buffer;
  ulong uVar4;
  int j;
  long lVar5;
  
  if (0 < len) {
    uVar4 = 0;
    do {
      iVar3 = *(int *)((long)user + 0x18);
      cVar1 = *(char *)((long)data + uVar4);
      if ((long)iVar3 < 1) {
        if (cVar1 != **(char **)((long)user + 8)) goto LAB_001028f1;
        *(undefined4 *)((long)user + 0x18) = 1;
      }
      else {
        cVar2 = (*(char **)((long)user + 8))[iVar3];
        if (cVar1 == cVar2) {
          *(int *)((long)user + 0x18) = iVar3 + 1;
        }
        else {
          if (cVar2 == '\0') {
            *(undefined4 *)((long)user + 0x18) = 0;
            fputs(*(char **)((long)user + 0x10),*user);
          }
          else {
            lVar5 = 0;
            do {
              fputc((int)*(char *)(*(long *)((long)user + 8) + lVar5),*user);
              lVar5 = lVar5 + 1;
            } while (lVar5 < *(int *)((long)user + 0x18));
            *(undefined4 *)((long)user + 0x18) = 0;
          }
          cVar1 = *(char *)((long)data + uVar4);
LAB_001028f1:
          fputc((int)cVar1,*user);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)len);
  }
  return 1;
}

Assistant:

int source_callback(const void* data, int len, void *user)
{
    source_data* env = (source_data*) user;
    const char* buffer = (const char*) data;
    int i = 0;

    // Copy the buffer to output and look for placeholder, replace it with data
    while (i < len)
    {
        // We are already recognizing placeholder
        if (env->state > 0) {
            if (buffer[i] == env->placeholder[env->state])
            {
                env->state++;
            } else {
                if (env->placeholder[env->state] == 0) // Placeholder recognized, insert data
                {

                    env->state = 0;

                    fprintf(env->out, "%s", env->identifier);
                    fputc(buffer[i], env->out);
                } else { // Not a placeholder, abort
                    int j;

                    for (j = 0; j < env->state; j++)
                        fputc(env->placeholder[j], env->out);

                    env->state = 0;

                    fputc(buffer[i], env->out);
                }

            }
        } else {
            if (buffer[i] == env->placeholder[0]) // Enter placeholder seek mode, pause output
            {
                env->state = 1;
            } else { // Output normally
                fputc(buffer[i], env->out);
            }
        }
        i++;
    }

    return 1;
}